

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_tzx.cpp
# Opt level: O2

void TZX_AppendPauseBlock(path *fname,uint16_t pauseAfterMs)

{
  FILE *__stream;
  string local_40;
  
  __stream = (FILE *)SJ_fopen(fname,"a+b");
  if (__stream == (FILE *)0x0) {
    std::filesystem::__cxx11::path::string(&local_40,fname);
    Error("[TZX] Error opening file for append",local_40._M_dataplus._M_p,FATAL);
    std::__cxx11::string::~string((string *)&local_40);
  }
  fputc(0x20,__stream);
  fputc((uint)(byte)pauseAfterMs,__stream);
  fputc((uint)(pauseAfterMs >> 8),__stream);
  fclose(__stream);
  return;
}

Assistant:

void TZX_AppendPauseBlock(const std::filesystem::path & fname, uint16_t pauseAfterMs)
{
	FILE* ff;
	if (!FOPEN_ISOK(ff, fname, "a+b")) {
		Error("[TZX] Error opening file for append", fname.string().c_str(), FATAL);
	}
	fputc(TZXBlockId::Pause, ff); // block id

	fputc(pauseAfterMs & 0xFF, ff);
	fputc(pauseAfterMs >> 8, ff);
	fclose(ff);
}